

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O2

UInt32 Bt3Zip_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  Byte *cur;
  ushort uVar1;
  UInt32 UVar2;
  UInt32 *pUVar3;
  UInt32 UVar4;
  
  lenLimit = p->lenLimit;
  if (lenLimit < 3) {
    MatchFinder_MovePos(p);
    UVar4 = 0;
  }
  else {
    cur = p->buffer;
    uVar1 = (ushort)p->crc[cur[1]] ^ CONCAT11(*cur,cur[2]);
    UVar2 = p->hash[uVar1];
    UVar4 = p->pos;
    p->hash[uVar1] = UVar4;
    pUVar3 = GetMatchesSpec1(lenLimit,UVar2,UVar4,cur,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                             p->cutValue,distances,2);
    UVar4 = (UInt32)((ulong)((long)pUVar3 - (long)distances) >> 2);
    p->cyclicBufferPos = p->cyclicBufferPos + 1;
    p->buffer = p->buffer + 1;
    UVar2 = p->pos + 1;
    p->pos = UVar2;
    if (UVar2 == p->posLimit) {
      MatchFinder_CheckLimits(p);
    }
  }
  return UVar4;
}

Assistant:

UInt32 Bt3Zip_MatchFinder_GetMatches(CMatchFinder *p, UInt32 *distances)
{
  UInt32 offset;
  GET_MATCHES_HEADER(3)
  HASH_ZIP_CALC;
  curMatch = p->hash[hv];
  p->hash[hv] = p->pos;
  offset = 0;
  GET_MATCHES_FOOTER(offset, 2)
}